

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void MetaEnumClass(nodeclass *Class,array *List)

{
  nodemeta *m;
  nodemeta *pnVar1;
  dataid Id;
  ulong local_20;
  
  if (Class->ParentClass != (nodeclass *)0x0) {
    MetaEnumClass(Class->ParentClass,List);
  }
  pnVar1 = Class->Meta;
  if (pnVar1 != (nodemeta *)0x0) {
    do {
      if (*(char *)pnVar1 == '\x1f') {
        local_20 = (ulong)(*(uint *)pnVar1 >> 8);
        ArrayAppend(List,&local_20,8,0x100);
      }
      else if (*(char *)pnVar1 == '\0') {
        return;
      }
      pnVar1 = pnVar1 + 1;
    } while( true );
  }
  return;
}

Assistant:

static NOINLINE void MetaEnumClass(const nodeclass* Class,array* List)
{
    if (Class->ParentClass)
        MetaEnumClass(Class->ParentClass,List);

    if (Class->Meta)
    {
        const nodemeta* m;
        for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
            if (m->Meta == META_PARAM_TYPE)
            {
                dataid Id = m->Id;
                ArrayAppend(List,&Id,sizeof(Id),256);
            }
    }
}